

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_DonateFullCordBufferAndBackup_Test::
TestBody(CordOutputStreamTest_DonateFullCordBufferAndBackup_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  byte bVar3;
  bool bVar4;
  CordRepFlat *pCVar5;
  pointer __s;
  undefined8 *puVar6;
  undefined8 extraout_RAX;
  sbyte sVar7;
  ulong uVar8;
  size_t __n;
  long lVar9;
  pointer *__ptr_2;
  int iVar10;
  undefined1 *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  sbyte sVar12;
  uint uVar13;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar14;
  char *pcVar15;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  Span<char> SVar16;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  CordBuffer buffer;
  Cord cord;
  AssertionResult gtest_ar_2;
  int size;
  void *data;
  void *next_available_data;
  void *available_data;
  CordOutputStream output;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 *local_f8 [2];
  anon_union_16_2_b9f6da03_for_Rep_1 local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  long local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_98 [20];
  int local_84;
  char *local_80;
  anon_union_16_2_b9f6da03_for_Rep_1 local_78;
  pointer local_60;
  pointer local_58;
  CordOutputStream local_50;
  
  pCVar5 = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  (pCVar5->super_CordRep).length = 0;
  local_e8.short_rep.raw_size = (char)pCVar5;
  local_e8._1_7_ = (undefined7)((ulong)pCVar5 >> 8);
  if (((ulong)pCVar5 & 1) == 0) {
    SVar16 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)&local_e8.long_rep);
  }
  else {
    SVar16 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)&local_e8.long_rep);
  }
  __n = SVar16.len_;
  __s = SVar16.ptr_;
  memset(__s,0x61,__n);
  uVar8 = 0xf;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    bVar3 = *(byte *)(CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + 0xc);
    iVar10 = -0xb8000;
    if (bVar3 < 0xbb) {
      iVar10 = -0xe80;
    }
    sVar12 = 0xc;
    if (bVar3 < 0xbb) {
      sVar12 = 6;
    }
    iVar14 = -0x10;
    if (0x42 < bVar3) {
      iVar14 = iVar10;
    }
    sVar7 = 3;
    if (0x42 < bVar3) {
      sVar7 = sVar12;
    }
    uVar8 = (ulong)(int)(((uint)bVar3 << sVar7) + iVar14 + -0xd);
  }
  if (uVar8 < __n) {
LAB_00b5f238:
    io::_GLOBAL__N_1::CordOutputStreamTest_DonateFullCordBufferAndBackup_Test::TestBody();
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_120,pbStack_120);
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    absl::lts_20250127::Cord::~Cord((Cord *)local_b8);
    CordOutputStream::~CordOutputStream(&local_50);
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)&local_e8.long_rep);
    _Unwind_Resume(extraout_RAX);
  }
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    lVar9 = *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size);
  }
  else {
    lVar9 = (long)(local_e8.short_rep.raw_size >> 1);
  }
  uVar8 = 0xf;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    bVar3 = *(byte *)(CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + 0xc);
    uVar13 = 0xfff48000;
    if (bVar3 < 0xbb) {
      uVar13 = 0xfffff180;
    }
    sVar12 = 0xc;
    if (bVar3 < 0xbb) {
      sVar12 = 6;
    }
    in_R9 = (char *)0xfffffff0;
    if (0x42 < bVar3) {
      in_R9 = (char *)(ulong)uVar13;
    }
    sVar7 = 3;
    if (0x42 < bVar3) {
      sVar7 = sVar12;
    }
    uVar8 = (ulong)(int)(((uint)bVar3 << sVar7) + (int)in_R9 + -0xd);
  }
  if (uVar8 < lVar9 + __n) goto LAB_00b5f238;
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) =
         *(long *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size) + __n;
  }
  else {
    local_e8.short_rep.raw_size = (char)SVar16.len_ * '\x02' + local_e8.short_rep.raw_size;
  }
  local_60 = __s + (__n - 100);
  local_78.short_rep.raw_size = local_e8.short_rep.raw_size;
  local_78._1_7_ = local_e8._1_7_;
  local_78._9_4_ = local_e8._9_4_;
  local_78._13_2_ = local_e8._13_2_;
  local_78.short_rep.data[0xe] = local_e8.short_rep.data[0xe];
  local_e8.short_rep.raw_size = 1;
  local_58 = __s;
  CordOutputStream::CordOutputStream(&local_50,(CordBuffer *)&local_78.long_rep,0);
  if ((local_78.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_78._1_7_,local_78.short_rep.raw_size));
  }
  CordOutputStream::BackUp(&local_50,100);
  bVar4 = CordOutputStream::Next(&local_50,&local_80,&local_84);
  local_108._M_head_impl._0_1_ = bVar4;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46b,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_d8._M_head_impl + 8))();
    }
  }
  if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_100,local_100);
  }
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)local_128,"data","next_available_data",&local_80,&local_60);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar15 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46c,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  local_108._M_head_impl._0_4_ = 100;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"size","100",&local_84,(int *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar15 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x46d,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  builtin_strncpy(local_80,
                  "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                  ,100);
  CordOutputStream::Consume((CordOutputStream *)local_b8);
  bVar4 = true;
  if ((Nonnull<CordRep_*>)auStack_b0._0_8_ != (Nonnull<CordRep_*>)0x0 && (local_b8[0] & 1) != 0) {
    local_128 = (undefined1  [8])0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar4 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_b0._0_8_,(Nonnull<absl::string_view_*>)local_128)
    ;
  }
  local_108._M_head_impl._0_1_ = bVar4;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4 == false) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_100;
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,(AssertionResult *)"cord.TryFlat()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x471,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_d8._M_head_impl + 8))();
    }
    __ptr_00 = local_100;
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5f1ec;
  }
  else {
    if ((Nonnull<CordRep_*>)auStack_b0._0_8_ == (Nonnull<CordRep_*>)0x0 ||
        ((long)(char)local_b8[0] & 1U) == 0) {
      if ((local_b8[0] & 1) == 0) {
        local_98._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)(long)(char)local_b8[0] >> 1);
        local_98._8_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b8 + 1);
      }
      else {
        local_98._0_8_ =
             *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)auStack_b0._0_8_;
        local_98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_128 = (undefined1  [8])0x0;
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_b0._0_8_,(Nonnull<absl::string_view_*>)local_128);
      local_98._0_8_ = local_128;
      local_98._8_8_ = pbStack_120;
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,(char)SVar16.len_ + -100);
    local_d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,'d');
    puVar2 = (undefined1 *)((long)&(local_100->_M_dataplus)._M_p + local_d0);
    puVar11 = &DAT_0000000f;
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      puVar11 = local_f8[0];
    }
    if (puVar11 < puVar2) {
      puVar11 = &DAT_0000000f;
      if (local_d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
        puVar11 = local_c8[0];
      }
      if (puVar11 < puVar2) goto LAB_00b5efe6;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_d8,0,(char *)0x0,(ulong)local_108._M_head_impl);
    }
    else {
LAB_00b5efe6:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_d8._M_head_impl);
    }
    local_128 = (undefined1  [8])&local_118;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar1) {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_118._8_8_ = puVar6[3];
    }
    else {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_128 = (undefined1  [8])*puVar6;
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar6[1];
    *puVar6 = paVar1;
    puVar6[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              ((internal *)(auStack_b0 + 8),"flat",
               "std::string(available.size() - 100, \'a\') + std::string(100, \'b\')",
               (basic_string_view<char,_std::char_traits<char>_> *)local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8) {
      operator_delete(local_d8._M_head_impl,(ulong)(local_c8[0] + 1));
    }
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      operator_delete(local_108._M_head_impl,(ulong)(local_f8[0] + 1));
    }
    if (auStack_b0[8] == '\0') {
      testing::Message::Message((Message *)local_128);
      if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = anon_var_dwarf_a12c75 + 5;
      }
      else {
        pcVar15 = (local_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x474,pcVar15);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_128 + 8))();
      }
    }
    if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a0,local_a0);
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98._8_8_;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_128,"flat.data()","available_data",(char **)&local_108,&local_58);
    if (local_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a12c75 + 5;
      }
      else {
        message = (pbStack_120->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x475,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_108._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b5f1ec;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_120;
    __ptr_00 = pbStack_120;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00b5f1ec:
  absl::lts_20250127::Cord::~Cord((Cord *)local_b8);
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  if ((local_e8.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)CONCAT71(local_e8._1_7_,local_e8.short_rep.raw_size));
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}